

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kepulauan.h
# Opt level: O0

void __thiscall Belitung::Belitung(Belitung *this)

{
  Point<double> local_170;
  Point<double> local_158;
  Point<double> local_140;
  Point<double> local_128;
  Point<double> local_110;
  Point<double> local_f8;
  Point<double> local_e0;
  Point<double> local_c8;
  Point<double> local_b0;
  Point<double> local_98;
  Point<double> local_80;
  Point<double> local_68;
  Point<double> local_50;
  Point<double> local_28;
  Belitung *local_10;
  Belitung *this_local;
  
  local_10 = this;
  Polygon::Polygon(&this->super_Polygon);
  Point<double>::Point(&local_28,140.0,50.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_50,250.0,0.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_68,550.0,50.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_80,650.0,120.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_98,700.0,200.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_b0,650.0,400.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_c8,640.0,500.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_e0,700.0,600.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_f8,450.0,600.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_110,450.0,550.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_128,300.0,450.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_140,300.0,550.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_158,100.0,600.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_170,110.0,200.0,0.0);
  Polygon::addPoint((Point_conflict *)this);
  return;
}

Assistant:

Belitung(){
    //addPoint(Point<double>(300, 200));
    //atas
    addPoint(Point<double>(140, 50));
    addPoint(Point<double>(250, 0));
    addPoint(Point<double>(550, 50));
    addPoint(Point<double>(650, 120));
    addPoint(Point<double>(700, 200));
    addPoint(Point<double>(650, 400));
    addPoint(Point<double>(640, 500));
    addPoint(Point<double>(700, 600));
    //lengkukan bawah
    addPoint(Point<double>(450, 600));
    addPoint(Point<double>(450, 550));
    addPoint(Point<double>(300, 450));
    addPoint(Point<double>(300, 550));
    addPoint(Point<double>(100, 600));
    addPoint(Point<double>(110, 200));
    
  }